

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O1

int LoudnessMeter::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pvVar2 = (state->field_0).field_0.effectdata;
  if (pvVar2 == (void *)0x0) {
    __assert_fail("effectdata",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfd,
                  "T *UnityAudioEffectState::GetEffectData() const [T = LoudnessMeter::EffectData]")
    ;
  }
  if ((state->field_0).field_0.internal == (void *)0x0) {
    __assert_fail("internal",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philips-software[P]unity-nativeaudioplugins/AudioPluginInterface.h"
                  ,0xfe,
                  "T *UnityAudioEffectState::GetEffectData() const [T = LoudnessMeter::EffectData]")
    ;
  }
  memcpy(outbuffer,inbuffer,(ulong)length * (long)inchannels * 4);
  if (length != 0) {
    uVar7 = (ulong)(uint)inchannels;
    uVar6 = 0;
    do {
      fVar9 = 0.0;
      fVar8 = 0.0;
      if (0 < inchannels) {
        uVar4 = 0;
        fVar10 = 0.0;
        fVar11 = 0.0;
        do {
          fVar1 = inbuffer[uVar4];
          fVar9 = *(float *)((long)pvVar2 + uVar4 * 4 + 0x10);
          pfVar5 = (float *)((long)pvVar2 + 0x54);
          if (fVar9 < ABS(fVar1)) {
            pfVar5 = (float *)((long)pvVar2 + 0x50);
          }
          fVar8 = *(float *)((long)pvVar2 + uVar4 * 4 + 0x30);
          fVar9 = (ABS(fVar1) - fVar9) * *pfVar5 + fVar9;
          pfVar5 = (float *)((long)pvVar2 + 0x54);
          if (fVar8 < fVar1 * fVar1) {
            pfVar5 = (float *)((long)pvVar2 + 0x50);
          }
          *(float *)((long)pvVar2 + uVar4 * 4 + 0x10) = fVar9;
          fVar8 = (fVar1 * fVar1 - fVar8) * *pfVar5 + fVar8;
          *(float *)((long)pvVar2 + uVar4 * 4 + 0x30) = fVar8;
          if (fVar9 <= fVar11) {
            fVar9 = fVar11;
          }
          if (fVar8 <= fVar10) {
            fVar8 = fVar10;
          }
          uVar4 = uVar4 + 1;
          fVar10 = fVar8;
          fVar11 = fVar9;
        } while (uVar7 != uVar4);
      }
      fVar10 = *(float *)((long)pvVar2 + 0x5c) + -1.0;
      *(float *)((long)pvVar2 + 0x5c) = fVar10;
      if (fVar10 <= 0.0) {
        *(float *)((long)pvVar2 + 0x5c) = fVar10 + *(float *)((long)pvVar2 + 0x58);
        iVar3 = *(int *)((long)pvVar2 + 100) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0x60)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0x68) + (long)iVar3 * 4) = fVar9;
        *(int *)((long)pvVar2 + 100) = iVar3;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        iVar3 = *(int *)((long)pvVar2 + 0x74) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0x70)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0x78) + (long)iVar3 * 4) = fVar8;
        *(int *)((long)pvVar2 + 0x74) = iVar3;
      }
      if (inchannels < 1) {
        fVar9 = 0.0;
        fVar8 = 0.0;
      }
      else {
        uVar4 = 0;
        fVar10 = 0.0;
        fVar11 = 0.0;
        do {
          fVar1 = inbuffer[uVar4];
          fVar9 = *(float *)((long)pvVar2 + uVar4 * 4 + 0x80);
          pfVar5 = (float *)((long)pvVar2 + 0xc4);
          if (fVar9 < ABS(fVar1)) {
            pfVar5 = (float *)((long)pvVar2 + 0xc0);
          }
          fVar8 = *(float *)((long)pvVar2 + uVar4 * 4 + 0xa0);
          fVar9 = (ABS(fVar1) - fVar9) * *pfVar5 + fVar9;
          pfVar5 = (float *)((long)pvVar2 + 0xc4);
          if (fVar8 < fVar1 * fVar1) {
            pfVar5 = (float *)((long)pvVar2 + 0xc0);
          }
          *(float *)((long)pvVar2 + uVar4 * 4 + 0x80) = fVar9;
          fVar8 = (fVar1 * fVar1 - fVar8) * *pfVar5 + fVar8;
          *(float *)((long)pvVar2 + uVar4 * 4 + 0xa0) = fVar8;
          if (fVar9 <= fVar11) {
            fVar9 = fVar11;
          }
          if (fVar8 <= fVar10) {
            fVar8 = fVar10;
          }
          uVar4 = uVar4 + 1;
          fVar10 = fVar8;
          fVar11 = fVar9;
        } while (uVar7 != uVar4);
      }
      fVar10 = *(float *)((long)pvVar2 + 0xcc) + -1.0;
      *(float *)((long)pvVar2 + 0xcc) = fVar10;
      if (fVar10 <= 0.0) {
        *(float *)((long)pvVar2 + 0xcc) = fVar10 + *(float *)((long)pvVar2 + 200);
        iVar3 = *(int *)((long)pvVar2 + 0xd4) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0xd0)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0xd8) + (long)iVar3 * 4) = fVar9;
        *(int *)((long)pvVar2 + 0xd4) = iVar3;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        iVar3 = *(int *)((long)pvVar2 + 0xe4) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0xe0)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0xe8) + (long)iVar3 * 4) = fVar8;
        *(int *)((long)pvVar2 + 0xe4) = iVar3;
      }
      if (inchannels < 1) {
        fVar9 = 0.0;
        fVar8 = 0.0;
      }
      else {
        uVar4 = 0;
        fVar10 = 0.0;
        fVar11 = 0.0;
        do {
          fVar1 = inbuffer[uVar4];
          fVar9 = *(float *)((long)pvVar2 + uVar4 * 4 + 0xf0);
          pfVar5 = (float *)((long)pvVar2 + 0x134);
          if (fVar9 < ABS(fVar1)) {
            pfVar5 = (float *)((long)pvVar2 + 0x130);
          }
          fVar8 = *(float *)((long)pvVar2 + uVar4 * 4 + 0x110);
          fVar9 = (ABS(fVar1) - fVar9) * *pfVar5 + fVar9;
          pfVar5 = (float *)((long)pvVar2 + 0x134);
          if (fVar8 < fVar1 * fVar1) {
            pfVar5 = (float *)((long)pvVar2 + 0x130);
          }
          *(float *)((long)pvVar2 + uVar4 * 4 + 0xf0) = fVar9;
          fVar8 = (fVar1 * fVar1 - fVar8) * *pfVar5 + fVar8;
          *(float *)((long)pvVar2 + uVar4 * 4 + 0x110) = fVar8;
          if (fVar9 <= fVar11) {
            fVar9 = fVar11;
          }
          if (fVar8 <= fVar10) {
            fVar8 = fVar10;
          }
          uVar4 = uVar4 + 1;
          fVar10 = fVar8;
          fVar11 = fVar9;
        } while (uVar7 != uVar4);
      }
      fVar10 = *(float *)((long)pvVar2 + 0x13c) + -1.0;
      *(float *)((long)pvVar2 + 0x13c) = fVar10;
      if (fVar10 <= 0.0) {
        *(float *)((long)pvVar2 + 0x13c) = fVar10 + *(float *)((long)pvVar2 + 0x138);
        iVar3 = *(int *)((long)pvVar2 + 0x144) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0x140)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0x148) + (long)iVar3 * 4) = fVar9;
        *(int *)((long)pvVar2 + 0x144) = iVar3;
        if (fVar8 < 0.0) {
          fVar8 = sqrtf(fVar8);
        }
        else {
          fVar8 = SQRT(fVar8);
        }
        iVar3 = *(int *)((long)pvVar2 + 0x154) + 1;
        if (iVar3 == *(int *)((long)pvVar2 + 0x150)) {
          iVar3 = 0;
        }
        *(float *)(*(long *)((long)pvVar2 + 0x158) + (long)iVar3 * 4) = fVar8;
        *(int *)((long)pvVar2 + 0x154) = iVar3;
      }
      uVar6 = uVar6 + 1;
      inbuffer = inbuffer + inchannels;
    } while (uVar6 != length);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        const float* src = inbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            data->momentary.Feed(src, inchannels);
            data->shortterm.Feed(src, inchannels);
            data->integrated.Feed(src, inchannels);
            src += inchannels;
        }

        return UNITY_AUDIODSP_OK;
    }